

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::
     PrintTupleTo<std::tuple<void(*)(unsigned_short_const*,int,unsigned_short*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*,int),std::tuple<int,int>,int>,2ul>
               (long t,ostream *param_2)

{
  FunctionPointerPrinter::
  PrintValue<void(unsigned_short_const*,int,unsigned_short*,int,int,int,InterpFilterParams_const*,InterpFilterParams_const*,int,int,int,int,ConvolveParams*,int),void>
            (*(_func_void_unsigned_short_ptr_int_unsigned_short_ptr_int_int_int_InterpFilterParams_ptr_InterpFilterParams_ptr_int_int_int_int_ConvolveParams_ptr_int
               **)(t + 0x10),param_2);
  std::__ostream_insert<char,std::char_traits<char>>(param_2,", ",2);
  PrintTo<int,int>((tuple<int,_int> *)(t + 4),param_2);
  return;
}

Assistant:

void PrintTupleTo(const T& t, std::integral_constant<size_t, I>,
                  ::std::ostream* os) {
  PrintTupleTo(t, std::integral_constant<size_t, I - 1>(), os);
  GTEST_INTENTIONAL_CONST_COND_PUSH_()
  if (I > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
    *os << ", ";
  }
  UniversalPrinter<typename std::tuple_element<I - 1, T>::type>::Print(
      std::get<I - 1>(t), os);
}